

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O0

DSVectorBase<double> * __thiscall
soplex::DSVectorBase<double>::operator=(DSVectorBase<double> *this,SVectorBase<double> *vec)

{
  DSVectorBase<double> *in_RSI;
  DSVectorBase<double> *in_RDI;
  
  if ((DSVectorBase<double> *)&in_RDI->super_SVectorBase<double> != in_RSI) {
    SVectorBase<double>::clear((SVectorBase<double> *)0x26fc0f);
    SVectorBase<double>::size((SVectorBase<double> *)in_RSI);
    makeMem(in_RSI,(int)((ulong)in_RDI >> 0x20));
    SVectorBase<double>::operator=((SVectorBase<double> *)this,vec);
  }
  return in_RDI;
}

Assistant:

DSVectorBase<R>& operator=(const SVectorBase<S>& vec)
   {
      if(this != &vec)
      {
         SVectorBase<R>::clear();
         makeMem(vec.size());
         SVectorBase<R>::operator=(vec);
      }

      return *this;
   }